

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

VkResult shim_vkEnumerateDeviceExtensionProperties
                   (VkPhysicalDevice physicalDevice,char *pLayerName,uint32_t *pPropertyCount,
                   VkExtensionProperties *pProperties)

{
  int iVar1;
  VkResult VVar2;
  PhysicalDeviceDetails *pPVar3;
  long lVar4;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *data_vec;
  pointer __s1;
  long lVar5;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_48;
  
  if (pLayerName == (char *)0x0) {
    pPVar3 = get_physical_device_details(physicalDevice);
    data_vec = &pPVar3->extensions;
LAB_00104a2c:
    VVar2 = fill_out_count_pointer_pair<VkExtensionProperties>(data_vec,pPropertyCount,pProperties);
    return VVar2;
  }
  if ((long)mock.instance_layers.
            super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)mock.instance_layers.
            super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar4 = ((long)mock.instance_layers.
                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)mock.instance_layers.
                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3) * 0xfc0fc0fc0fc0fc1;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    lVar5 = 0;
    __s1 = mock.instance_layers.
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_start;
    do {
      iVar1 = strcmp(__s1->layerName,pLayerName);
      if (iVar1 == 0) {
        data_vec = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                   ((long)mock.per_layer_device_extension_properties.
                          super__Vector_base<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>,_std::allocator<std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - lVar5);
        goto LAB_00104a2c;
      }
      lVar5 = lVar5 + -0x18;
      __s1 = __s1 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  local_48.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar2 = fill_out_count_pointer_pair<VkExtensionProperties>(&local_48,pPropertyCount,pProperties);
  if (local_48.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return VVar2;
}

Assistant:

VKAPI_ATTR VkResult VKAPI_CALL shim_vkEnumerateDeviceExtensionProperties(
    VkPhysicalDevice physicalDevice, const char* pLayerName, uint32_t* pPropertyCount, VkExtensionProperties* pProperties) {
    if (pLayerName) {
        for (size_t i = 0; i < mock.instance_layers.size(); i++) {
            if (strcmp(mock.instance_layers[i].layerName, pLayerName) == 0) {
                return fill_out_count_pointer_pair(mock.per_layer_device_extension_properties[i], pPropertyCount, pProperties);
            }
        }
        // Layer not found, fill out with empty list
        return fill_out_count_pointer_pair({}, pPropertyCount, pProperties);
    }
    return fill_out_count_pointer_pair(get_physical_device_details(physicalDevice).extensions, pPropertyCount, pProperties);
}